

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getDrho(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  FuncflParameters local_88;
  
  getFuncflParam(&local_88,this);
  FuncflParameters::~FuncflParameters(&local_88);
  return local_88.drho;
}

Assistant:

RealType EAMAdapter::getDrho() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.drho;
  }